

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O0

void __thiscall psy::TextElement::TextElement(TextElement *this,char *chars,uint size)

{
  uint uVar1;
  char *pcVar2;
  uint size_local;
  char *chars_local;
  TextElement *this_local;
  
  this->_vptr_TextElement = (_func_int **)&PTR__TextElement_0019e880;
  this->size_ = size;
  pcVar2 = (char *)operator_new__((ulong)(size + 1));
  this->chars_ = pcVar2;
  this->next_ = (TextElement *)0x0;
  strncpy(this->chars_,chars,(ulong)size);
  this->chars_[size] = '\0';
  uVar1 = hashCode(this->chars_,this->size_);
  this->hashCode_ = uVar1;
  return;
}

Assistant:

TextElement::TextElement(const char* chars, unsigned int size)
    : size_(size)
    , chars_(new char[size + 1])
    , next_(nullptr)
{
    std::strncpy(chars_, chars, size);
    chars_[size] = 0;
    hashCode_ = hashCode(chars_, size_);
}